

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

void __thiscall GlobalMemoryAccountant::~GlobalMemoryAccountant(GlobalMemoryAccountant *this)

{
  restoreMemoryAllocators(this);
  if (this->mallocAllocator_ != (AccountingTestMemoryAllocator *)0x0) {
    (*(this->mallocAllocator_->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[1])();
  }
  if (this->newAllocator_ != (AccountingTestMemoryAllocator *)0x0) {
    (*(this->newAllocator_->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[1])();
  }
  if (this->newArrayAllocator_ != (AccountingTestMemoryAllocator *)0x0) {
    (*(this->newArrayAllocator_->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[1])();
  }
  MemoryAccountant::~MemoryAccountant(&this->accountant_);
  return;
}

Assistant:

GlobalMemoryAccountant::~GlobalMemoryAccountant()
{
    restoreMemoryAllocators();
    delete mallocAllocator_;
    delete newAllocator_;
    delete newArrayAllocator_;
}